

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O0

void __thiscall unit_test::main(unit_test *this,string *param_2)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  ulong uVar3;
  uint i;
  ostream *out;
  bool bad_found;
  uint local_24;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Running sync test\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  calls = calls + 1;
  bVar1 = false;
  cppcms::application::response();
  this_00 = (void *)cppcms::http::response::out();
  local_24 = 0;
  do {
    if (9999999 < local_24) {
LAB_00110e4d:
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Sync Disconned as expected");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        bad_count = bad_count + 1;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Sync Not disconnected!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      return;
    }
    poVar2 = (ostream *)std::ostream::operator<<(this_00,local_24);
    poVar2 = std::operator<<(poVar2,'\n');
    uVar3 = std::ios::operator!((ios *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)));
    if ((uVar3 & 1) != 0) {
      bVar1 = true;
      goto LAB_00110e4d;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

virtual void main(std::string /*unused*/)
	{
		std::cout << "Running sync test\n" << std::endl;
		calls ++;
		bool bad_found = false;
		std::ostream &out = response().out();
		for(unsigned i=0;i<10000000;i++) {
			if(!(out << i << '\n')) {
				bad_found = true;
				break;
			}
		}
		if(bad_found) {
			std::cout << "Sync Disconned as expected" << std::endl;
			bad_count++;
		}
		else {
			std::cout << "Sync Not disconnected!" << std::endl;
		}
	}